

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

void * __thiscall google::protobuf::internal::ExtensionSet::Extension::PrefetchPtr(Extension *this)

{
  bool v2;
  Nonnull<const_char_*> pcVar1;
  
  v2 = (bool)((byte)(this->type - 9) < 4 | this->is_repeated);
  if (v2 == (bool)(this->field_0xa & 1)) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       ((bool)(this->field_0xa & 1),v2,
                        "is_pointer == is_repeated || FieldTypeIsPointer(type)");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    if ((this->field_0xa & 1) != 0) {
      this = (Extension *)(this->field_0).int64_t_value;
    }
    return this;
  }
  PrefetchPtr();
}

Assistant:

const void* PrefetchPtr() const {
      ABSL_DCHECK_EQ(is_pointer, is_repeated || FieldTypeIsPointer(type));
      // We don't want to prefetch invalid/null pointers so if there isn't a
      // pointer to prefetch, then return `this`.
      return is_pointer ? absl::bit_cast<const void*>(ptr) : this;
    }